

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtablewidget.cpp
# Opt level: O1

void __thiscall QTableWidgetItem::setSelected(QTableWidgetItem *this,bool select)

{
  QItemSelectionModel *pQVar1;
  char *__s;
  long in_FS_OFFSET;
  undefined1 local_38 [16];
  QTableWidgetItem *local_28;
  Data *local_20;
  
  local_20 = *(Data **)(in_FS_OFFSET + 0x28);
  if ((QAbstractItemView *)this->view != (QAbstractItemView *)0x0) {
    pQVar1 = QAbstractItemView::selectionModel((QAbstractItemView *)this->view);
    if (pQVar1 != (QItemSelectionModel *)0x0) {
      QAbstractItemView::model((QAbstractItemView *)this->view);
      __s = (char *)QMetaObject::cast((QObject *)&QTableModel::staticMetaObject);
      if (__s != (char *)0x0) {
        local_28 = (QTableWidgetItem *)&DAT_aaaaaaaaaaaaaaaa;
        local_38._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_38._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        QTableModel::index((QTableModel *)local_38,__s,(int)this);
        pQVar1 = QAbstractItemView::selectionModel((QAbstractItemView *)this->view);
        (**(code **)(*(long *)pQVar1 + 0x68))(pQVar1,local_38,!select * '\x02' + '\x02');
      }
    }
  }
  if (*(Data **)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTableWidgetItem::setSelected(bool select)
{
    if (!view || !view->selectionModel())
        return;
    const QTableModel *model = qobject_cast<const QTableModel*>(view->model());
    if (!model)
        return;
    const QModelIndex index = model->index(this);
    view->selectionModel()->select(index, select ? QItemSelectionModel::Select : QItemSelectionModel::Deselect);
}